

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall
bssl::Array<unsigned_short>::InitUninitialized(Array<unsigned_short> *this,size_t new_size)

{
  unsigned_short *puVar1;
  size_t new_size_local;
  Array<unsigned_short> *this_local;
  
  Reset(this);
  if (new_size == 0) {
    this_local._7_1_ = true;
  }
  else if (new_size < 0x8000000000000000) {
    puVar1 = (unsigned_short *)OPENSSL_malloc(new_size << 1);
    this->data_ = puVar1;
    if (this->data_ == (unsigned_short *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this->size_ = new_size;
      this_local._7_1_ = true;
    }
  }
  else {
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                  ,0xd5);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InitUninitialized(size_t new_size) {
    Reset();
    if (new_size == 0) {
      return true;
    }

    if (new_size > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    data_ = reinterpret_cast<T *>(OPENSSL_malloc(new_size * sizeof(T)));
    if (data_ == nullptr) {
      return false;
    }
    size_ = new_size;
    return true;
  }